

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O3

Bool prvTidyEntityInfo(ctmbstr name,Bool isXml,uint *code,uint *versions)

{
  char cVar1;
  uint uVar2;
  uint in_EAX;
  int iVar3;
  char *pcVar4;
  entity *peVar5;
  ctmbstr ptVar6;
  uint c;
  undefined8 uStack_38;
  
  if ((name == (ctmbstr)0x0) || (*name != '&')) {
    __assert_fail("name && name[0] == \'&\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/entities.c"
                  ,0x163,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
  }
  if (code == (uint *)0x0) {
    __assert_fail("code != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/entities.c"
                  ,0x164,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
  }
  if (versions != (uint *)0x0) {
    cVar1 = name[1];
    if (cVar1 != '\0') {
      if (cVar1 == '#') {
        uStack_38 = (ulong)in_EAX;
        if ((name[2] == 'x') || (name[2] == 'X' && isXml == no)) {
          ptVar6 = name + 3;
          pcVar4 = "%x";
        }
        else {
          ptVar6 = name + 2;
          pcVar4 = "%u";
        }
        __isoc99_sscanf(ptVar6,pcVar4,(long)&uStack_38 + 4);
        *code = uStack_38._4_4_;
        *versions = 0x61fff;
        return yes;
      }
      pcVar4 = "quot";
      peVar5 = entities;
      do {
        peVar5 = peVar5 + 1;
        if ((cVar1 == *pcVar4) && (iVar3 = prvTidytmbstrcmp(name + 1,pcVar4), iVar3 == 0)) {
          uVar2 = peVar5[-1].versions;
          *code = peVar5[-1].code;
          *versions = uVar2;
          return yes;
        }
        pcVar4 = peVar5->name;
      } while (pcVar4 != (ctmbstr)0x0);
    }
    *code = 0;
    *versions = (uint)(isXml != no) * 0x2000 + 0xe000;
    return no;
  }
  __assert_fail("versions != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/entities.c"
                ,0x165,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
}

Assistant:

Bool TY_(EntityInfo)( ctmbstr name, Bool isXml, uint* code, uint* versions )
{
    const entity* np;
    assert( name && name[0] == '&' );
    assert( code != NULL );
    assert( versions != NULL );

    /* numeric entitity: name = "&#" followed by number */
    if ( name[1] == '#' )
    {
        uint c = 0;  /* zero on missing/bad number */

        /* 'x' prefix denotes hexadecimal number format */
        if ( name[2] == 'x' || (!isXml && name[2] == 'X') )
            sscanf( name+3, "%x", &c );
        else
            sscanf( name+2, "%u", &c );

        *code = c;
        *versions = VERS_ALL;
        return yes;
    }

    /* Named entity: name ="&" followed by a name */
    if ( NULL != (np = entitiesLookup(name+1)) )
    {
        *code = np->code;
        *versions = np->versions;
        return yes;
    }

    *code = 0;
    *versions = ( isXml ? VERS_XML : VERS_PROPRIETARY );
    return no;
}